

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall brynet::net::EventLoop::processAsyncProcs(EventLoop *this)

{
  pointer pfVar1;
  _Any_data *p_Var2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pfVar5;
  int iVar6;
  _Any_data *__pos;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->mAsyncProcsMutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pfVar1 = (this->mCopyAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->mCopyAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->mAsyncProcs).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  pfVar3 = (this->mCopyAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar4 = (this->mCopyAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pfVar5 = (this->mAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->mCopyAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->mAsyncProcs).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->mCopyAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar5;
  (this->mAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = pfVar3;
  (this->mAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar4;
  (this->mAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mAsyncProcsMutex);
  __pos = (_Any_data *)
          (this->mCopyAsyncProcs).
          super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (_Any_data *)
           (this->mCopyAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__pos != p_Var2) {
    do {
      if (*(long *)(__pos + 1) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(__pos->_M_pod_data + 0x18))(__pos);
      __pos = __pos + 2;
    } while (__pos != p_Var2);
    __pos = (_Any_data *)
            (this->mCopyAsyncProcs).
            super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_M_erase_at_end
            (&this->mCopyAsyncProcs,(pointer)__pos);
  return;
}

Assistant:

void EventLoop::processAsyncProcs()
{
    {
        std::lock_guard<std::mutex> lck(mAsyncProcsMutex);
        mCopyAsyncProcs.swap(mAsyncProcs);
    }

    for (const auto& x : mCopyAsyncProcs)
    {
        x();
    }
    mCopyAsyncProcs.clear();
}